

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O0

void chacha20_iv(chacha20 *ctx,uchar *iv)

{
  uint32_t uVar1;
  uchar *iv_local;
  chacha20 *ctx_local;
  
  ctx->state[0xc] = 0;
  ctx->state[0xd] = 0;
  uVar1 = GET_32BIT_MSB_FIRST(iv);
  ctx->state[0xe] = uVar1;
  uVar1 = GET_32BIT_MSB_FIRST(iv + 4);
  ctx->state[0xf] = uVar1;
  ctx->currentIndex = 0x40;
  return;
}

Assistant:

static void chacha20_iv(struct chacha20 *ctx, const unsigned char *iv)
{
    ctx->state[12] = 0;
    ctx->state[13] = 0;
    ctx->state[14] = GET_32BIT_MSB_FIRST(iv);
    ctx->state[15] = GET_32BIT_MSB_FIRST(iv + 4);

    /* New IV, dump context */
    ctx->currentIndex = 64;
}